

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

string * __thiscall
prometheus::Gateway::getUri
          (string *__return_storage_ptr__,Gateway *this,CollectableEntry *collectable)

{
  ostream *poVar1;
  stringstream uri;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = ::std::operator<<(local_190,(string *)this);
  poVar1 = ::std::operator<<(poVar1,(string *)&this->labels_);
  ::std::operator<<(poVar1,(string *)&collectable->second);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Gateway::getUri(const CollectableEntry& collectable) const {
  std::stringstream uri;
  uri << jobUri_ << labels_ << collectable.second;

  return uri.str();
}